

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::checkGPUShader5Support(Context *context)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  deBool dVar3;
  RenderContext *pRVar4;
  ContextInfo *this;
  NotSupportedError *this_00;
  bool supportsES32;
  Context *context_local;
  
  pRVar4 = gles31::Context::getRenderContext(context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    if (!bVar1) {
      this = gles31::Context::getContextInfo(context);
      bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_EXT_gpu_shader5");
      if (!bVar2) break;
    }
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      return;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_EXT_gpu_shader5 is not supported",
             "supportsES32 || context.getContextInfo().isExtensionSupported(\"GL_EXT_gpu_shader5\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x5fd);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

static void checkGPUShader5Support (Context& context)
{
	const bool supportsES32 = glu::contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"), "GL_EXT_gpu_shader5 is not supported");
}